

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTest.c
# Opt level: O0

void Gia_ParTestSimulate2(Gia_Man_t *p,int nWords,int nProcs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int local_99c;
  int nCountFanins;
  int status;
  int iFan;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Vec_Int_t *vStack;
  Par_ThData_t ThData [100];
  pthread_t WorkerThread [100];
  int nProcs_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  if (100 < nProcs) {
    __assert_fail("nProcs <= PAR_THR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                  ,0xf2,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
  }
  Gia_ManRandom(1);
  Gia_ParTestAlloc(p,nWords);
  Gia_ParTestSimulateInit(p);
  p_00 = Vec_IntAlloc(1000);
  iFan = Vec_IntSize(p->vCis);
  while (iFan = iFan + -1, -1 < iFan) {
    iVar2 = Vec_IntEntry(p->vCis,iFan);
    Vec_IntPush(p_00,iVar2);
  }
  Vec_IntPush(p_00,0);
  Gia_ManStaticFanoutStart(p);
  p_01 = Gia_ManCreateFaninCounts(p);
  local_99c = Vec_IntSum(p_01);
  for (iFan = 0; iFan < nProcs; iFan = iFan + 1) {
    *(Gia_Man_t **)&ThData[(long)iFan + -1].Id = p;
    *(undefined4 *)&ThData[iFan].p = 0xffffffff;
    *(undefined4 *)((long)&ThData[iFan].p + 4) = 0;
    iVar2 = pthread_create(WorkerThread + (long)iFan + -1,(pthread_attr_t *)0x0,Gia_ParWorkerThread,
                           &ThData[(long)iFan + -1].Id);
    if (iVar2 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                    ,0x104,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
    }
  }
  do {
    bVar1 = true;
    if (local_99c < 1) {
      iVar2 = Vec_IntSize(p_00);
      bVar1 = 0 < iVar2;
    }
    if (!bVar1) {
      for (status = 0; iVar2 = Vec_IntSize(p_01), status < iVar2; status = status + 1) {
        uVar4 = Vec_IntEntry(p_01,status);
        if (uVar4 != 0) {
          printf("%d -> %d    ",(ulong)(uint)status,(ulong)uVar4);
          pObj = Gia_ManObj(p,status);
          Gia_ObjPrint(p,pObj);
        }
      }
      do {
        iFan = 0;
        while ((iFan < nProcs && (*(int *)((long)&ThData[iFan].p + 4) == 0))) {
          iFan = iFan + 1;
        }
      } while (iFan != nProcs);
      iFan = 0;
      while( true ) {
        if (nProcs <= iFan) {
          Gia_ManStaticFanoutStop(p);
          Vec_IntFree(p_00);
          Vec_IntFree(p_01);
          Gia_ParTestFree(p);
          return;
        }
        if (*(int *)((long)&ThData[iFan].p + 4) != 0) break;
        *(undefined4 *)&ThData[iFan].p = 0xffffffff;
        *(undefined4 *)((long)&ThData[iFan].p + 4) = 1;
        iFan = iFan + 1;
      }
      __assert_fail("ThData[i].Status == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                    ,0x132,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
    }
    for (iFan = 0; iFan < nProcs; iFan = iFan + 1) {
      if (*(int *)((long)&ThData[iFan].p + 4) == 0) {
        if (*(int *)((long)&ThData[iFan].p + 4) != 0) {
          __assert_fail("ThData[i].Status == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                        ,0x10c,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
        }
        if (-1 < *(int *)&ThData[iFan].p) {
          for (status = 0; iVar2 = Gia_ObjFanoutNumId(p,*(int *)&ThData[iFan].p), status < iVar2;
              status = status + 1) {
            iVar2 = Gia_ObjFanoutId(p,*(int *)&ThData[iFan].p,status);
            iVar3 = Vec_IntEntry(p_01,iVar2);
            if (iVar3 < 1) {
              __assert_fail("Vec_IntEntry(vFanins, iFan) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x111,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            iVar3 = Vec_IntAddToEntry(p_01,iVar2,-1);
            if (iVar3 == 0) {
              Vec_IntPush(p_00,iVar2);
            }
            if (local_99c < 1) {
              __assert_fail("nCountFanins > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTest.c"
                            ,0x114,"void Gia_ParTestSimulate2(Gia_Man_t *, int, int)");
            }
            local_99c = local_99c + -1;
          }
          *(undefined4 *)&ThData[iFan].p = 0xffffffff;
        }
        iVar2 = Vec_IntSize(p_00);
        if (0 < iVar2) {
          iVar2 = Vec_IntPop(p_00);
          *(int *)&ThData[iFan].p = iVar2;
          *(undefined4 *)((long)&ThData[iFan].p + 4) = 1;
        }
      }
    }
  } while( true );
}

Assistant:

void Gia_ParTestSimulate2( Gia_Man_t * p, int nWords, int nProcs )
{
	pthread_t WorkerThread[PAR_THR_MAX];
    Par_ThData_t ThData[PAR_THR_MAX];
    Vec_Int_t * vStack, * vFanins;
    int i, k, iFan, status, nCountFanins;
    assert( nProcs <= PAR_THR_MAX );
    Gia_ManRandom( 1 );
    Gia_ParTestAlloc( p, nWords );
    Gia_ParTestSimulateInit( p );
    // start the stack
    vStack = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryReverse( p->vCis, iFan, i )
        Vec_IntPush( vStack, iFan );
    Vec_IntPush( vStack, 0 );
    Gia_ManStaticFanoutStart( p );
    vFanins = Gia_ManCreateFaninCounts( p );
    nCountFanins = Vec_IntSum(vFanins);
    // start the threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p = p;
        ThData[i].Id = -1;
        ThData[i].Status = 0;
        status = pthread_create( WorkerThread + i, NULL, Gia_ParWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    while ( nCountFanins > 0 || Vec_IntSize(vStack) > 0 )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].Status )
                continue;
            assert( ThData[i].Status == 0 );
            if ( ThData[i].Id >= 0 )
            {
                Gia_ObjForEachFanoutStaticId( p, ThData[i].Id, iFan, k )
                {
                    assert( Vec_IntEntry(vFanins, iFan) > 0 );
                    if ( Vec_IntAddToEntry(vFanins, iFan, -1) == 0 )
                        Vec_IntPush( vStack, iFan );
                    assert( nCountFanins > 0 );
                    nCountFanins--;
                }
                ThData[i].Id = -1;
            }
            if ( Vec_IntSize(vStack) > 0 )
            {
                ThData[i].Id = Vec_IntPop( vStack );
                ThData[i].Status = 1;
            }
        }
    }
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( iFan != 0 )
        {
            printf( "%d -> %d    ", k, iFan );
            Gia_ObjPrint( p, Gia_ManObj(p, k) );
        }
//    assert( Vec_IntSum(vFanins) == 0 );
    // stop the threads
    while ( 1 )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].Status )
                break;
        if ( i == nProcs )
            break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        assert( ThData[i].Status == 0 );
        ThData[i].Id = -1;
        ThData[i].Status = 1;
    }
    Gia_ManStaticFanoutStop( p );
    Vec_IntFree( vStack );
    Vec_IntFree( vFanins );
//    Gia_ParComputeSignature( p, nWords ); printf( "   " );
    Gia_ParTestFree( p );
}